

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v8::detail::default_arg_formatter<char16_t>::operator()
          (default_arg_formatter<char16_t> *this,void *value)

{
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar1;
  basic_format_specs<char16_t> local_18;
  
  local_18.width = 0;
  local_18.precision = -1;
  local_18.type = none;
  local_18._9_2_ = local_18._9_2_ & 0xfe00;
  local_18.fill.data_[0] = L' ';
  local_18.fill.data_[1] = L'\0';
  local_18.fill.data_[2] = L'\0';
  local_18.fill.data_[3] = L'\0';
  local_18.fill.size_ = '\x01';
  bVar1 = write<char16_t,_std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_void,_0>
                    ((this->out).container,value,&local_18,(locale_ref)0x0);
  return (iterator)bVar1.container;
}

Assistant:

auto operator()(T value) -> iterator {
    return write<Char>(out, value);
  }